

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaBlockMetadata::PrintDetailedMap_Begin
          (VmaBlockMetadata *this,VmaJsonWriter *json,VkDeviceSize unusedBytes,
          size_t allocationCount,size_t unusedRangeCount)

{
  VmaVector<char,_VmaStlAllocator<char>_> *pVVar1;
  size_t sVar2;
  
  VmaJsonWriter::BeginString(json,"TotalBytes");
  pVVar1 = &json->m_SB->m_Data;
  sVar2 = pVVar1->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar1,sVar2 + 1);
  pVVar1->m_pArray[sVar2] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::WriteNumber(json,this->m_Size);
  VmaJsonWriter::BeginString(json,"UnusedBytes");
  pVVar1 = &json->m_SB->m_Data;
  sVar2 = pVVar1->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar1,sVar2 + 1);
  pVVar1->m_pArray[sVar2] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::WriteSize(json,unusedBytes);
  VmaJsonWriter::BeginString(json,"Allocations");
  pVVar1 = &json->m_SB->m_Data;
  sVar2 = pVVar1->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar1,sVar2 + 1);
  pVVar1->m_pArray[sVar2] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::WriteSize(json,allocationCount);
  VmaJsonWriter::BeginString(json,"UnusedRanges");
  pVVar1 = &json->m_SB->m_Data;
  sVar2 = pVVar1->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar1,sVar2 + 1);
  pVVar1->m_pArray[sVar2] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::WriteSize(json,unusedRangeCount);
  VmaJsonWriter::BeginString(json,"Suballocations");
  pVVar1 = &json->m_SB->m_Data;
  sVar2 = pVVar1->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar1,sVar2 + 1);
  pVVar1->m_pArray[sVar2] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::BeginArray(json,false);
  return;
}

Assistant:

void VmaBlockMetadata::PrintDetailedMap_Begin(class VmaJsonWriter& json,
    VkDeviceSize unusedBytes, size_t allocationCount, size_t unusedRangeCount) const
{
    json.WriteString("TotalBytes");
    json.WriteNumber(GetSize());

    json.WriteString("UnusedBytes");
    json.WriteSize(unusedBytes);

    json.WriteString("Allocations");
    json.WriteSize(allocationCount);

    json.WriteString("UnusedRanges");
    json.WriteSize(unusedRangeCount);

    json.WriteString("Suballocations");
    json.BeginArray();
}